

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fLightAmountTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::LightAmountTest::init(LightAmountTest *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  LightAmountCase *pLVar1;
  
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"none",0,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"1dir",1,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"2dir",2,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"4dir",4,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"6dir",6,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"8dir",8,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"10dir",10,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"12dir",0xc,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"14dir",0xe,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"16dir",0x10,0,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"1omni",0,1,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"2omni",0,2,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"4omni",0,4,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"6omni",0,6,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"8omni",0,8,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"10omni",0,10,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"12omni",0,0xc,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"14omni",0,0xe,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LightAmountCase *)operator_new(0x88);
  LightAmountCase::LightAmountCase(pLVar1,(this->super_TestCaseGroup).m_context,"16omni",0,0x10,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  return extraout_EAX;
}

Assistant:

void LightAmountTest::init (void)
{
	//										name				dir,	omni,	spot
	addChild(new LightAmountCase(m_context, "none",				0,		0,		0	));
	addChild(new LightAmountCase(m_context, "1dir",				1,		0,		0	));
	addChild(new LightAmountCase(m_context, "2dir",				2,		0,		0	));
	addChild(new LightAmountCase(m_context, "4dir",				4,		0,		0	));
	addChild(new LightAmountCase(m_context, "6dir",				6,		0,		0	));
	addChild(new LightAmountCase(m_context, "8dir",				8,		0,		0	));
	addChild(new LightAmountCase(m_context, "10dir",			10,		0,		0	));
	addChild(new LightAmountCase(m_context, "12dir",			12,		0,		0	));
	addChild(new LightAmountCase(m_context, "14dir",			14,		0,		0	));
	addChild(new LightAmountCase(m_context, "16dir",			16,		0,		0	));
	addChild(new LightAmountCase(m_context, "1omni",			0,		1,		0	));
	addChild(new LightAmountCase(m_context, "2omni",			0,		2,		0	));
	addChild(new LightAmountCase(m_context, "4omni",			0,		4,		0	));
	addChild(new LightAmountCase(m_context, "6omni",			0,		6,		0	));
	addChild(new LightAmountCase(m_context, "8omni",			0,		8,		0	));
	addChild(new LightAmountCase(m_context, "10omni",			0,		10,		0	));
	addChild(new LightAmountCase(m_context, "12omni",			0,		12,		0	));
	addChild(new LightAmountCase(m_context, "14omni",			0,		14,		0	));
	addChild(new LightAmountCase(m_context, "16omni",			0,		16,		0	));
//	addChild(new LightAmountCase(m_context, "1spot",			0,		0,		1	));
//	addChild(new LightAmountCase(m_context, "2spot",			0,		0,		2	));
//	addChild(new LightAmountCase(m_context, "4spot",			0,		0,		4	));
//	addChild(new LightAmountCase(m_context, "6spot",			0,		0,		6	));
//	addChild(new LightAmountCase(m_context, "8spot",			0,		0,		8	));
//	addChild(new LightAmountCase(m_context, "1dir_1omni",		1,		1,		0	));
//	addChild(new LightAmountCase(m_context, "2dir_2omni",		2,		2,		0	));
//	addChild(new LightAmountCase(m_context, "4dir_4omni",		4,		4,		0	));
//	addChild(new LightAmountCase(m_context, "1dir_1spot",		1,		0,		1	));
//	addChild(new LightAmountCase(m_context, "2dir_2spot",		2,		0,		2	));
//	addChild(new LightAmountCase(m_context, "4dir_4spot",		4,		0,		4	));
//	addChild(new LightAmountCase(m_context, "1omni_1spot",		0,		1,		1	));
//	addChild(new LightAmountCase(m_context, "2omni_2spot",		0,		2,		2	));
//	addChild(new LightAmountCase(m_context, "4omni_4spot",		0,		4,		4	));
//	addChild(new LightAmountCase(m_context, "1dir_1omni_1spot",	1,		1,		1	));
//	addChild(new LightAmountCase(m_context, "2dir_2omni_2spot",	2,		2,		2	));
//	addChild(new LightAmountCase(m_context, "4dir_2omni_2spot",	4,		2,		2	));
//	addChild(new LightAmountCase(m_context, "2dir_4omni_2spot",	2,		4,		2	));
//	addChild(new LightAmountCase(m_context, "2dir_2omni_4spot",	2,		2,		4	));
//	addChild(new LightAmountCase(m_context, "4dir_4omni_4spot",	4,		4,		4	));
}